

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Scl_Pair_t Scl_LibertyUpdateHead(Scl_Tree_t *p,Scl_Pair_t Head)

{
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  byte *pbVar10;
  
  uVar9 = Head.Beg;
  pcVar2 = p->pContents;
  if ((long)(int)uVar9 < (long)Head >> 0x20) {
    pbVar10 = (byte *)(pcVar2 + (int)uVar9);
    pbVar5 = (byte *)0x0;
    pbVar7 = (byte *)0x0;
    do {
      if (*pbVar10 == 10) {
        p->nLines = p->nLines + 1;
      }
      bVar1 = *pbVar10;
      if (((0x20 < (ulong)bVar1) ||
          (bVar4 = false, (0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         (bVar4 = false, bVar1 != 0x5c)) {
        bVar4 = true;
      }
      pbVar8 = pbVar7;
      if (pbVar7 == (byte *)0x0) {
        pbVar8 = pbVar10;
      }
      if (bVar4) {
        pbVar5 = pbVar10;
        pbVar7 = pbVar8;
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 < pcVar2 + ((long)Head >> 0x20));
  }
  else {
    pbVar7 = (byte *)0x0;
    pbVar5 = (byte *)0x0;
  }
  uVar6 = (ulong)(((int)pbVar5 - (int)pcVar2) + 1);
  uVar3 = (int)pbVar7 - (int)pcVar2;
  if (pbVar5 == (byte *)0x0 || pbVar7 == (byte *)0x0) {
    uVar6 = (ulong)Head >> 0x20;
    uVar3 = uVar9;
  }
  return (Scl_Pair_t)((ulong)uVar3 | uVar6 << 0x20);
}

Assistant:

static inline Scl_Pair_t Scl_LibertyUpdateHead( Scl_Tree_t * p, Scl_Pair_t Head )
{
    Scl_Pair_t Res;
    char * pBeg = p->pContents + Head.Beg;
    char * pEnd = p->pContents + Head.End;
    char * pFirstNonSpace = NULL;
    char * pLastNonSpace = NULL;
    char * pChar;
    for ( pChar = pBeg; pChar < pEnd; pChar++ )
    {
        if ( *pChar == '\n' )
            p->nLines++;
        if ( Scl_LibertyCharIsSpace(*pChar) )
            continue;
        pLastNonSpace = pChar;
        if ( pFirstNonSpace == NULL )
            pFirstNonSpace = pChar;
    }
    if ( pFirstNonSpace == NULL || pLastNonSpace == NULL )
        return Head;
    assert( pFirstNonSpace && pLastNonSpace );
    Res.Beg = pFirstNonSpace - p->pContents;
    Res.End = pLastNonSpace  - p->pContents + 1;
    return Res;
}